

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  undefined8 uVar2;
  Geometry *this;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 (*pauVar7) [16];
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  undefined7 extraout_var;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  ulong uVar13;
  size_t i;
  byte bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar28;
  float fVar29;
  undefined1 auVar25 [16];
  float fVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined4 local_104c;
  float local_1048 [6];
  ulong local_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  ulong local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  uVar10 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar10 == 8) {
    return false;
  }
  local_f78 = uVar10;
  uStack_f70 = 0;
  fVar48 = (query->p).field_0.field_0.x;
  fVar52 = (query->p).field_0.field_0.y;
  fVar56 = (query->p).field_0.field_0.z;
  fVar63 = (context->query_radius).field_0.m128[0];
  fVar60 = (context->query_radius).field_0.m128[1];
  fVar61 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_fc8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    local_fc8 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  pauVar11 = (undefined1 (*) [16])local_f68;
  local_104c = 0;
  local_f98 = fVar48;
  fStack_f94 = fVar48;
  fStack_f90 = fVar48;
  fStack_f8c = fVar48;
  local_fa8 = fVar52;
  fStack_fa4 = fVar52;
  fStack_fa0 = fVar52;
  fStack_f9c = fVar52;
  local_fb8 = fVar56;
  fStack_fb4 = fVar56;
  fStack_fb0 = fVar56;
  fStack_fac = fVar56;
  fVar49 = fVar48;
  fVar50 = fVar48;
  fVar51 = fVar48;
  fVar53 = fVar52;
  fVar54 = fVar52;
  fVar55 = fVar52;
  fVar57 = fVar56;
  fVar58 = fVar56;
  fVar59 = fVar56;
  do {
    local_ff8 = fVar48 - fVar63;
    fStack_ff4 = fVar49 - fVar63;
    fStack_ff0 = fVar50 - fVar63;
    fStack_fec = fVar51 - fVar63;
    local_1008 = fVar48 + fVar63;
    fStack_1004 = fVar49 + fVar63;
    fStack_1000 = fVar50 + fVar63;
    fStack_ffc = fVar51 + fVar63;
    local_1018._0_4_ = fVar52 - fVar60;
    local_1018._4_4_ = fVar53 - fVar60;
    fStack_1010 = fVar54 - fVar60;
    fStack_100c = fVar55 - fVar60;
    local_fd8 = fVar60 + fVar52;
    fStack_fd4 = fVar60 + fVar53;
    fStack_fd0 = fVar60 + fVar54;
    fStack_fcc = fVar60 + fVar55;
    local_1028 = fVar56 - fVar61;
    fStack_1024 = fVar57 - fVar61;
    fStack_1020 = fVar58 - fVar61;
    fStack_101c = fVar59 - fVar61;
    local_fe8._0_4_ = fVar61 + fVar56;
    local_fe8._4_4_ = fVar61 + fVar57;
    fStack_fe0 = fVar61 + fVar58;
    fStack_fdc = fVar61 + fVar59;
    fVar60 = fVar63 * fVar63;
    fVar61 = fVar63 * fVar63;
    fVar62 = fVar63 * fVar63;
    fVar63 = fVar63 * fVar63;
    local_f88 = fVar60;
    fStack_f84 = fVar61;
    fStack_f80 = fVar62;
    fStack_f7c = fVar63;
    auVar64 = local_fc8;
LAB_006a699d:
    do {
      do {
        if (pauVar11 == (undefined1 (*) [16])&local_f78) {
          return SUB41(local_104c,0);
        }
        pauVar7 = pauVar11 + -1;
        pauVar11 = pauVar11 + -1;
      } while (auVar64._0_4_ < *(float *)((long)*pauVar7 + 8));
      uVar12 = *(ulong *)*pauVar11;
LAB_006a69bb:
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar12 & 8) != 0) goto LAB_006a6cbf;
        auVar23 = *(undefined1 (*) [16])(uVar12 + 0x60);
        auVar27 = *(undefined1 (*) [16])(uVar12 + 0x20);
        auVar25 = *(undefined1 (*) [16])(uVar12 + 0x30);
        auVar39 = *(undefined1 (*) [16])(uVar12 + 0x40);
        auVar44 = *(undefined1 (*) [16])(uVar12 + 0x50);
        auVar32 = *(undefined1 (*) [16])(uVar12 + 0x70);
        auVar45._4_4_ = fVar49;
        auVar45._0_4_ = fVar48;
        auVar45._8_4_ = fVar50;
        auVar45._12_4_ = fVar51;
        auVar45 = maxps(auVar45,auVar27);
        auVar45 = minps(auVar45,auVar25);
        fVar24 = auVar45._0_4_ - fVar48;
        fVar29 = auVar45._4_4_ - fVar49;
        fVar31 = auVar45._8_4_ - fVar50;
        fVar35 = auVar45._12_4_ - fVar51;
        auVar47._4_4_ = fVar53;
        auVar47._0_4_ = fVar52;
        auVar47._8_4_ = fVar54;
        auVar47._12_4_ = fVar55;
        auVar45 = maxps(auVar47,auVar39);
        auVar45 = minps(auVar45,auVar44);
        fVar37 = auVar45._0_4_ - fVar52;
        fVar40 = auVar45._4_4_ - fVar53;
        fVar41 = auVar45._8_4_ - fVar54;
        fVar42 = auVar45._12_4_ - fVar55;
        auVar46._4_4_ = fVar57;
        auVar46._0_4_ = fVar56;
        auVar46._8_4_ = fVar58;
        auVar46._12_4_ = fVar59;
        auVar45 = maxps(auVar46,auVar23);
        auVar45 = minps(auVar45,auVar32);
        fVar28 = auVar45._0_4_ - fVar56;
        fVar30 = auVar45._4_4_ - fVar57;
        fVar34 = auVar45._8_4_ - fVar58;
        fVar36 = auVar45._12_4_ - fVar59;
        local_1048[0] = fVar28 * fVar28 + fVar37 * fVar37 + fVar24 * fVar24;
        local_1048[1] = fVar30 * fVar30 + fVar40 * fVar40 + fVar29 * fVar29;
        local_1048[2] = fVar34 * fVar34 + fVar41 * fVar41 + fVar31 * fVar31;
        local_1048[3] = fVar36 * fVar36 + fVar42 * fVar42 + fVar35 * fVar35;
        bVar5 = ((auVar23._0_4_ <= (float)local_fe8._0_4_ && local_ff8 <= auVar25._0_4_) &&
                (auVar39._0_4_ <= local_fd8 && auVar27._0_4_ <= local_1008)) &&
                (local_1028 <= auVar32._0_4_ &&
                ((float)local_1018._0_4_ <= auVar44._0_4_ && auVar27._0_4_ <= auVar25._0_4_));
        bVar6 = ((auVar23._4_4_ <= (float)local_fe8._4_4_ && fStack_ff4 <= auVar25._4_4_) &&
                (auVar39._4_4_ <= fStack_fd4 && auVar27._4_4_ <= fStack_1004)) &&
                (fStack_1024 <= auVar32._4_4_ &&
                ((float)local_1018._4_4_ <= auVar44._4_4_ && auVar27._4_4_ <= auVar25._4_4_));
        bVar4 = ((auVar23._8_4_ <= fStack_fe0 && fStack_ff0 <= auVar25._8_4_) &&
                (auVar39._8_4_ <= fStack_fd0 && auVar27._8_4_ <= fStack_1000)) &&
                (fStack_1020 <= auVar32._8_4_ &&
                (fStack_1010 <= auVar44._8_4_ && auVar27._8_4_ <= auVar25._8_4_));
        bVar8 = ((auVar23._12_4_ <= fStack_fdc && fStack_fec <= auVar25._12_4_) &&
                (auVar39._12_4_ <= fStack_fcc && auVar27._12_4_ <= fStack_ffc)) &&
                (fStack_101c <= auVar32._12_4_ &&
                (fStack_100c <= auVar44._12_4_ && auVar27._12_4_ <= auVar25._12_4_));
LAB_006a6a2b:
        auVar23._0_4_ = (uint)bVar5 * -0x80000000;
        auVar23._4_4_ = (uint)bVar6 * -0x80000000;
        auVar23._8_4_ = (uint)bVar4 * -0x80000000;
        auVar23._12_4_ = (uint)bVar8 * -0x80000000;
        uVar9 = movmskps((int)uVar10,auVar23);
        uVar10 = (ulong)uVar9;
        if (uVar9 != 0) {
          uVar13 = uVar12 & 0xfffffffffffffff0;
          lVar3 = 0;
          if ((byte)uVar9 != 0) {
            for (; ((byte)uVar9 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar13 + lVar3 * 8);
          uVar9 = (uVar9 & 0xff) - 1 & uVar9 & 0xff;
          uVar12 = uVar10;
          if (uVar9 != 0) {
            fVar24 = local_1048[lVar3];
            lVar3 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            uVar12 = *(ulong *)(uVar13 + lVar3 * 8);
            fVar28 = local_1048[lVar3];
            uVar9 = uVar9 - 1 & uVar9;
            if (uVar9 == 0) {
              if ((uint)fVar24 < (uint)fVar28) {
                *(ulong *)*pauVar11 = uVar12;
                *(float *)((long)*pauVar11 + 8) = fVar28;
                pauVar11 = pauVar11 + 1;
                uVar12 = uVar10;
              }
              else {
                *(ulong *)*pauVar11 = uVar10;
                *(float *)((long)*pauVar11 + 8) = fVar24;
                uVar10 = uVar12;
                pauVar11 = pauVar11 + 1;
              }
            }
            else {
              auVar27._8_4_ = fVar24;
              auVar27._0_8_ = uVar10;
              auVar27._12_4_ = 0;
              auVar32._8_4_ = fVar28;
              auVar32._0_8_ = uVar12;
              auVar32._12_4_ = 0;
              lVar3 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              uVar2 = *(undefined8 *)(uVar13 + lVar3 * 8);
              fVar29 = local_1048[lVar3];
              auVar26._8_4_ = fVar29;
              auVar26._0_8_ = uVar2;
              auVar26._12_4_ = 0;
              auVar15._8_4_ = -(uint)((int)fVar24 < (int)fVar28);
              uVar9 = uVar9 - 1 & uVar9;
              if (uVar9 == 0) {
                auVar15._4_4_ = auVar15._8_4_;
                auVar15._0_4_ = auVar15._8_4_;
                auVar15._12_4_ = auVar15._8_4_;
                auVar38._8_4_ = fVar28;
                auVar38._0_8_ = uVar12;
                auVar38._12_4_ = 0;
                auVar39 = blendvps(auVar38,auVar27,auVar15);
                auVar23 = blendvps(auVar27,auVar32,auVar15);
                auVar16._8_4_ = -(uint)(auVar39._8_4_ < (int)fVar29);
                auVar16._4_4_ = auVar16._8_4_;
                auVar16._0_4_ = auVar16._8_4_;
                auVar16._12_4_ = auVar16._8_4_;
                auVar33._8_4_ = fVar29;
                auVar33._0_8_ = uVar2;
                auVar33._12_4_ = 0;
                auVar25 = blendvps(auVar33,auVar39,auVar16);
                auVar39 = blendvps(auVar39,auVar26,auVar16);
                auVar17._8_4_ = -(uint)(auVar23._8_4_ < auVar39._8_4_);
                auVar17._4_4_ = auVar17._8_4_;
                auVar17._0_4_ = auVar17._8_4_;
                auVar17._12_4_ = auVar17._8_4_;
                auVar27 = blendvps(auVar39,auVar23,auVar17);
                auVar23 = blendvps(auVar23,auVar39,auVar17);
                *pauVar11 = auVar23;
                pauVar11[1] = auVar27;
                uVar10 = auVar25._0_8_;
                pauVar11 = pauVar11 + 2;
                uVar12 = uVar10;
              }
              else {
                lVar3 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                auVar18._4_4_ = auVar15._8_4_;
                auVar18._0_4_ = auVar15._8_4_;
                auVar18._8_4_ = auVar15._8_4_;
                auVar18._12_4_ = auVar15._8_4_;
                auVar39 = blendvps(auVar32,auVar27,auVar18);
                auVar23 = blendvps(auVar27,auVar32,auVar18);
                auVar43._8_4_ = local_1048[lVar3];
                auVar43._0_8_ = *(undefined8 *)(uVar13 + lVar3 * 8);
                auVar43._12_4_ = 0;
                auVar19._8_4_ = -(uint)((int)fVar29 < (int)local_1048[lVar3]);
                auVar19._4_4_ = auVar19._8_4_;
                auVar19._0_4_ = auVar19._8_4_;
                auVar19._12_4_ = auVar19._8_4_;
                auVar25 = blendvps(auVar43,auVar26,auVar19);
                auVar27 = blendvps(auVar26,auVar43,auVar19);
                auVar20._8_4_ = -(uint)(auVar23._8_4_ < auVar27._8_4_);
                auVar20._4_4_ = auVar20._8_4_;
                auVar20._0_4_ = auVar20._8_4_;
                auVar20._12_4_ = auVar20._8_4_;
                auVar44 = blendvps(auVar27,auVar23,auVar20);
                auVar23 = blendvps(auVar23,auVar27,auVar20);
                auVar21._8_4_ = -(uint)(auVar39._8_4_ < auVar25._8_4_);
                auVar21._4_4_ = auVar21._8_4_;
                auVar21._0_4_ = auVar21._8_4_;
                auVar21._12_4_ = auVar21._8_4_;
                auVar27 = blendvps(auVar25,auVar39,auVar21);
                auVar39 = blendvps(auVar39,auVar25,auVar21);
                auVar22._8_4_ = -(uint)(auVar39._8_4_ < auVar44._8_4_);
                auVar22._4_4_ = auVar22._8_4_;
                auVar22._0_4_ = auVar22._8_4_;
                auVar22._12_4_ = auVar22._8_4_;
                auVar25 = blendvps(auVar44,auVar39,auVar22);
                auVar39 = blendvps(auVar39,auVar44,auVar22);
                *pauVar11 = auVar23;
                pauVar11[1] = auVar39;
                pauVar11[2] = auVar25;
                uVar10 = auVar27._0_8_;
                pauVar11 = pauVar11 + 3;
                uVar12 = uVar10;
              }
            }
          }
          goto LAB_006a69bb;
        }
        goto LAB_006a699d;
      }
      if ((uVar12 & 8) == 0) {
        auVar23 = *(undefined1 (*) [16])(uVar12 + 0x20);
        auVar27 = *(undefined1 (*) [16])(uVar12 + 0x30);
        auVar25._4_4_ = fVar49;
        auVar25._0_4_ = fVar48;
        auVar25._8_4_ = fVar50;
        auVar25._12_4_ = fVar51;
        auVar25 = maxps(auVar25,auVar23);
        auVar25 = minps(auVar25,auVar27);
        fVar24 = auVar25._0_4_ - fVar48;
        fVar28 = auVar25._4_4_ - fVar49;
        fVar29 = auVar25._8_4_ - fVar50;
        fVar30 = auVar25._12_4_ - fVar51;
        auVar39._4_4_ = fVar53;
        auVar39._0_4_ = fVar52;
        auVar39._8_4_ = fVar54;
        auVar39._12_4_ = fVar55;
        auVar25 = maxps(auVar39,*(undefined1 (*) [16])(uVar12 + 0x40));
        auVar25 = minps(auVar25,*(undefined1 (*) [16])(uVar12 + 0x50));
        fVar31 = auVar25._0_4_ - fVar52;
        fVar34 = auVar25._4_4_ - fVar53;
        fVar35 = auVar25._8_4_ - fVar54;
        fVar36 = auVar25._12_4_ - fVar55;
        auVar44._4_4_ = fVar57;
        auVar44._0_4_ = fVar56;
        auVar44._8_4_ = fVar58;
        auVar44._12_4_ = fVar59;
        auVar25 = maxps(auVar44,*(undefined1 (*) [16])(uVar12 + 0x60));
        auVar25 = minps(auVar25,*(undefined1 (*) [16])(uVar12 + 0x70));
        fVar37 = auVar25._0_4_ - fVar56;
        fVar40 = auVar25._4_4_ - fVar57;
        fVar41 = auVar25._8_4_ - fVar58;
        fVar42 = auVar25._12_4_ - fVar59;
        local_1048[0] = fVar37 * fVar37 + fVar31 * fVar31 + fVar24 * fVar24;
        local_1048[1] = fVar40 * fVar40 + fVar34 * fVar34 + fVar28 * fVar28;
        local_1048[2] = fVar41 * fVar41 + fVar35 * fVar35 + fVar29 * fVar29;
        local_1048[3] = fVar42 * fVar42 + fVar36 * fVar36 + fVar30 * fVar30;
        bVar5 = auVar23._0_4_ <= auVar27._0_4_ && local_1048[0] <= fVar60;
        bVar6 = auVar23._4_4_ <= auVar27._4_4_ && local_1048[1] <= fVar61;
        bVar4 = auVar23._8_4_ <= auVar27._8_4_ && local_1048[2] <= fVar62;
        bVar8 = auVar23._12_4_ <= auVar27._12_4_ && local_1048[3] <= fVar63;
        goto LAB_006a6a2b;
      }
LAB_006a6cbf:
      uVar10 = (ulong)((uint)uVar12 & 0xf) - 8;
      local_1030 = uVar10;
      bVar14 = 0;
      for (uVar13 = 0; local_1030 != uVar13; uVar13 = uVar13 + 1) {
        uVar9 = *(uint *)((uVar12 & 0xfffffffffffffff0) + uVar13 * 8);
        this = (context->scene->geometries).items[uVar9].ptr;
        context->geomID = uVar9;
        context->primID = *(uint *)((uVar12 & 0xfffffffffffffff0) + 4 + uVar13 * 8);
        bVar8 = Geometry::pointQuery(this,query,context);
        uVar10 = CONCAT71(extraout_var,bVar8);
        bVar14 = bVar14 | bVar8;
        fVar48 = local_f98;
        fVar49 = fStack_f94;
        fVar50 = fStack_f90;
        fVar51 = fStack_f8c;
        fVar52 = local_fa8;
        fVar53 = fStack_fa4;
        fVar54 = fStack_fa0;
        fVar55 = fStack_f9c;
        fVar56 = local_fb8;
        fVar57 = fStack_fb4;
        fVar58 = fStack_fb0;
        fVar59 = fStack_fac;
        fVar60 = local_f88;
        fVar61 = fStack_f84;
        fVar62 = fStack_f80;
        fVar63 = fStack_f7c;
      }
      auVar64 = local_fc8;
    } while (bVar14 == 0);
    auVar64 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar63 = auVar64._0_4_;
    fVar60 = auVar64._4_4_;
    fVar61 = auVar64._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_fc8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_fc8 = dpps(auVar64,auVar64,0x7f);
    }
    uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
    local_104c = (undefined4)uVar10;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }